

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

Bigint * diff(Bigint *a,Bigint *b)

{
  int iVar1;
  ulong uVar2;
  ULong *pUVar3;
  ULong *pUVar4;
  unsigned_long_long uVar5;
  unsigned_long_long y;
  unsigned_long_long borrow;
  ULong *xc;
  ULong *xbe;
  ULong *xb;
  ULong *xae;
  ULong *xa;
  int local_30;
  int wb;
  int wa;
  int i;
  Bigint *c;
  Bigint *b_local;
  Bigint *a_local;
  
  iVar1 = cmp(a,b);
  if (iVar1 == 0) {
    a_local = Balloc(0);
    a_local->wds = 1;
    a_local->x[0] = 0;
  }
  else {
    c = b;
    b_local = a;
    if (iVar1 < 0) {
      c = a;
      b_local = b;
    }
    wb = (int)(iVar1 < 0);
    a_local = Balloc(b_local->k);
    a_local->sign = wb;
    local_30 = b_local->wds;
    iVar1 = c->wds;
    y = 0;
    borrow = (unsigned_long_long)a_local->x;
    xbe = c->x;
    xae = b_local->x;
    do {
      pUVar3 = xae + 1;
      pUVar4 = xbe + 1;
      uVar2 = ((ulong)*xae - (ulong)*xbe) - y;
      y = uVar2 >> 0x20 & 1;
      uVar5 = borrow + 4;
      *(int *)borrow = (int)uVar2;
      borrow = uVar5;
      xbe = pUVar4;
      xae = pUVar3;
    } while (pUVar4 < c->x + iVar1);
    while (xae < b_local->x + local_30) {
      uVar2 = *xae - y;
      y = uVar2 >> 0x20 & 1;
      *(int *)borrow = (int)uVar2;
      borrow = borrow + 4;
      xae = xae + 1;
    }
    while (*(int *)(borrow - 4) == 0) {
      local_30 = local_30 + -1;
      borrow = borrow - 4;
    }
    a_local->wds = local_30;
  }
  return a_local;
}

Assistant:

static Bigint *
diff(Bigint *a, Bigint *b MTd)
{
	Bigint *c;
	int i, wa, wb;
	ULong *xa, *xae, *xb, *xbe, *xc;
#ifdef ULLong
	ULLong borrow, y;
#else
	ULong borrow, y;
#ifdef Pack_32
	ULong z;
#endif
#endif

	i = cmp(a,b);
	if (!i) {
		c = Balloc(0 MTa);
		c->wds = 1;
		c->x[0] = 0;
		return c;
		}
	if (i < 0) {
		c = a;
		a = b;
		b = c;
		i = 1;
		}
	else
		i = 0;
	c = Balloc(a->k MTa);
	c->sign = i;
	wa = a->wds;
	xa = a->x;
	xae = xa + wa;
	wb = b->wds;
	xb = b->x;
	xbe = xb + wb;
	xc = c->x;
	borrow = 0;
#ifdef ULLong
	do {
		y = (ULLong)*xa++ - *xb++ - borrow;
		borrow = y >> 32 & (ULong)1;
		*xc++ = y & FFFFFFFF;
		}
		while(xb < xbe);
	while(xa < xae) {
		y = *xa++ - borrow;
		borrow = y >> 32 & (ULong)1;
		*xc++ = y & FFFFFFFF;
		}
#else
#ifdef Pack_32
	do {
		y = (*xa & 0xffff) - (*xb & 0xffff) - borrow;
		borrow = (y & 0x10000) >> 16;
		z = (*xa++ >> 16) - (*xb++ >> 16) - borrow;
		borrow = (z & 0x10000) >> 16;
		Storeinc(xc, z, y);
		}
		while(xb < xbe);
	while(xa < xae) {
		y = (*xa & 0xffff) - borrow;
		borrow = (y & 0x10000) >> 16;
		z = (*xa++ >> 16) - borrow;
		borrow = (z & 0x10000) >> 16;
		Storeinc(xc, z, y);
		}
#else
	do {
		y = *xa++ - *xb++ - borrow;
		borrow = (y & 0x10000) >> 16;
		*xc++ = y & 0xffff;
		}
		while(xb < xbe);
	while(xa < xae) {
		y = *xa++ - borrow;
		borrow = (y & 0x10000) >> 16;
		*xc++ = y & 0xffff;
		}
#endif
#endif
	while(!*--xc)
		wa--;
	c->wds = wa;
	return c;
	}